

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O3

size_t lws_buflist_use_segment(lws_buflist **head,size_t len)

{
  lws_buflist *plVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  
  plVar1 = *head;
  if (plVar1 == (lws_buflist *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                  ,0x8f,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
  }
  if (len != 0) {
    uVar6 = len + plVar1->pos;
    uVar2 = plVar1->len;
    if (uVar2 < uVar6) {
      __assert_fail("b->pos + len <= b->len",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                    ,0x91,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
    }
    plVar1->pos = uVar6;
    if (uVar6 < uVar2) {
      uVar3 = (int)uVar2 - (int)uVar6;
    }
    else {
      iVar4 = lws_buflist_destroy_segment(head);
      if (iVar4 == 0) {
        sVar5 = lws_buflist_next_segment_len(head,(uint8_t **)0x0);
        return sVar5;
      }
      uVar3 = 0;
    }
    return (ulong)uVar3;
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/buflist.c"
                ,0x90,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
}

Assistant:

size_t
lws_buflist_use_segment(struct lws_buflist **head, size_t len)
{
	struct lws_buflist *b = (*head);

	assert(b);
	assert(len);
	assert(b->pos + len <= b->len);

	b->pos = b->pos + (size_t)len;

	assert(b->pos <= b->len);

	if (b->pos < b->len)
		return (unsigned int)(b->len - b->pos);

	if (lws_buflist_destroy_segment(head))
		/* last segment was just destroyed */
		return 0;

	return lws_buflist_next_segment_len(head, NULL);
}